

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  undefined8 uVar1;
  long *plVar2;
  char *pcVar3;
  string *psVar4;
  int iVar5;
  undefined1 auVar6 [12];
  allocator local_1a;
  allocator local_19;
  
  auVar6 = __cxa_rethrow();
  iVar5 = auVar6._8_4_;
  uVar1 = auVar6._0_8_;
  if (iVar5 == 4) {
    plVar2 = (long *)__cxa_begin_catch(uVar1);
    pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_1a);
  }
  else if (iVar5 == 3) {
    psVar4 = (string *)__cxa_begin_catch(uVar1);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar4);
  }
  else {
    pcVar3 = (char *)__cxa_begin_catch(uVar1);
    if (iVar5 == 2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_19);
    }
    else {
      tryTranslators_abi_cxx11_
                (__return_storage_ptr__,this,
                 (const_iterator)
                 (this->m_translators).
                 super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  __cxa_end_catch();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string translateActiveException() const {
            try {
#ifdef __OBJC__
                // In Objective-C try objective-c exceptions first
                @try {
                    throw;
                }
                @catch (NSException *exception) {
                    return toString( [exception description] );
                }
#else
                throw;
#endif
            }
            catch( std::exception& ex ) {
                return ex.what();
            }
            catch( std::string& msg ) {
                return msg;
            }
            catch( const char* msg ) {
                return msg;
            }
            catch(...) {
                return tryTranslators( m_translators.begin() );
            }
        }